

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateLookUpInIndexCache
          (Lowerer *this,Instr *instrInsert,RegOpnd *indexOpnd,RegOpnd *baseOpnd,
          RegOpnd *opndSlotArray,RegOpnd *opndSlotIndex,uint32 inlineCacheOffset,
          uint32 hitRateOffset,LabelInstr *labelHelper,FldInfoFlags flags)

{
  code *pcVar1;
  RegOpnd *baseOpnd_00;
  bool bVar2;
  uint32 offset;
  uint uVar3;
  RegOpnd *dst;
  IndirOpnd *pIVar4;
  LabelInstr *dst_00;
  undefined4 *puVar5;
  Type *ppBVar6;
  IntConstOpnd *src2;
  bool local_ab;
  bool local_aa;
  bool local_a9;
  bool local_99;
  IntConstOpnd *incOpnd;
  IndirOpnd *hitRateOpnd;
  RegOpnd *taggedTypeOpnd;
  LabelInstr *nextLabel;
  BranchInstr *branchToPatch;
  LabelInstr *slotIndexLoadedLabel;
  RegOpnd *inlineCacheOpnd;
  RegOpnd *objectTypeOpnd;
  bool checkLocalAuxSlots;
  bool checkLocalInlineSlots;
  bool doAdd;
  bool fromProto;
  bool fromLocal;
  bool fromAuxSlots;
  RegOpnd *pRStack_50;
  bool fromInlineSlots;
  RegOpnd *opndSlotIndex_local;
  RegOpnd *opndSlotArray_local;
  RegOpnd *baseOpnd_local;
  RegOpnd *indexOpnd_local;
  Instr *instrInsert_local;
  Lowerer *this_local;
  
  objectTypeOpnd._7_1_ = (flags & FldInfo_FromInlineSlots) == FldInfo_FromInlineSlots;
  objectTypeOpnd._6_1_ = (flags & FldInfo_FromAuxSlots) == FldInfo_FromAuxSlots;
  objectTypeOpnd._5_1_ = (flags & FldInfo_FromLocal) == FldInfo_FromLocal;
  objectTypeOpnd._4_1_ = (flags & FldInfo_FromProto) == FldInfo_FromProto;
  objectTypeOpnd._3_1_ =
       (flags & FldInfo_FromLocalWithoutProperty) == FldInfo_FromLocalWithoutProperty;
  local_99 = true;
  if (flags != FldInfo_NoInfo) {
    local_a9 = (bool)objectTypeOpnd._7_1_ && (bool)objectTypeOpnd._5_1_;
    local_99 = local_a9;
  }
  objectTypeOpnd._2_1_ = local_99;
  local_aa = true;
  if (flags != FldInfo_NoInfo) {
    local_ab = (bool)objectTypeOpnd._6_1_ && (bool)objectTypeOpnd._5_1_;
    local_aa = local_ab;
  }
  objectTypeOpnd._1_1_ = local_aa;
  pRStack_50 = opndSlotIndex;
  opndSlotIndex_local = opndSlotArray;
  opndSlotArray_local = baseOpnd;
  baseOpnd_local = indexOpnd;
  indexOpnd_local = (RegOpnd *)instrInsert;
  instrInsert_local = (Instr *)this;
  LowererMD::GenerateObjectTest
            (&this->m_lowererMD,&baseOpnd->super_Opnd,instrInsert,labelHelper,false);
  dst = IR::RegOpnd::New(TyUint64,this->m_func);
  baseOpnd_00 = opndSlotArray_local;
  inlineCacheOpnd = dst;
  offset = Js::RecyclableObject::GetOffsetOfType();
  pIVar4 = IR::IndirOpnd::New(baseOpnd_00,offset,TyUint64,this->m_func,false);
  InsertMove(&dst->super_Opnd,&pIVar4->super_Opnd,(Instr *)indexOpnd_local,true);
  dst_00 = (LabelInstr *)IR::RegOpnd::New(TyUint64,this->m_func);
  slotIndexLoadedLabel = dst_00;
  pIVar4 = IR::IndirOpnd::New(baseOpnd_local,inlineCacheOffset,TyUint64,this->m_func,false);
  InsertMove((Opnd *)dst_00,&pIVar4->super_Opnd,(Instr *)indexOpnd_local,true);
  GenerateDynamicLoadPolymorphicInlineCacheSlot
            (this,(Instr *)indexOpnd_local,(RegOpnd *)slotIndexLoadedLabel,
             &inlineCacheOpnd->super_Opnd);
  branchToPatch = (BranchInstr *)IR::LabelInstr::New(Label,this->m_func,false);
  nextLabel = (LabelInstr *)0x0;
  taggedTypeOpnd = (RegOpnd *)0x0;
  hitRateOpnd = (IndirOpnd *)0x0;
  if ((objectTypeOpnd._2_1_ & 1) != 0) {
    GenerateLookUpInIndexCacheHelper<true,true,false>
              (this,(Instr *)indexOpnd_local,opndSlotArray_local,opndSlotIndex_local,pRStack_50,
               inlineCacheOpnd,(RegOpnd *)slotIndexLoadedLabel,(LabelInstr *)branchToPatch,
               labelHelper,(LabelInstr **)&taggedTypeOpnd,(BranchInstr **)&nextLabel,
               (RegOpnd **)&hitRateOpnd);
  }
  if ((objectTypeOpnd._1_1_ & 1) != 0) {
    GenerateLookUpInIndexCacheHelper<true,false,false>
              (this,(Instr *)indexOpnd_local,opndSlotArray_local,opndSlotIndex_local,pRStack_50,
               inlineCacheOpnd,(RegOpnd *)slotIndexLoadedLabel,(LabelInstr *)branchToPatch,
               labelHelper,(LabelInstr **)&taggedTypeOpnd,(BranchInstr **)&nextLabel,
               (RegOpnd **)&hitRateOpnd);
  }
  if ((objectTypeOpnd._4_1_ & 1) != 0) {
    if ((objectTypeOpnd._7_1_ & 1) != 0) {
      GenerateLookUpInIndexCacheHelper<false,true,false>
                (this,(Instr *)indexOpnd_local,opndSlotArray_local,opndSlotIndex_local,pRStack_50,
                 inlineCacheOpnd,(RegOpnd *)slotIndexLoadedLabel,(LabelInstr *)branchToPatch,
                 labelHelper,(LabelInstr **)&taggedTypeOpnd,(BranchInstr **)&nextLabel,
                 (RegOpnd **)&hitRateOpnd);
    }
    if ((objectTypeOpnd._6_1_ & 1) != 0) {
      GenerateLookUpInIndexCacheHelper<false,false,false>
                (this,(Instr *)indexOpnd_local,opndSlotArray_local,opndSlotIndex_local,pRStack_50,
                 inlineCacheOpnd,(RegOpnd *)slotIndexLoadedLabel,(LabelInstr *)branchToPatch,
                 labelHelper,(LabelInstr **)&taggedTypeOpnd,(BranchInstr **)&nextLabel,
                 (RegOpnd **)&hitRateOpnd);
    }
  }
  if ((objectTypeOpnd._3_1_ & 1) != 0) {
    if (opndSlotIndex_local == (RegOpnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x414e,"(opndSlotArray)","opndSlotArray");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if ((objectTypeOpnd._7_1_ & 1) != 0) {
      GenerateLookUpInIndexCacheHelper<true,true,true>
                (this,(Instr *)indexOpnd_local,opndSlotArray_local,opndSlotIndex_local,pRStack_50,
                 inlineCacheOpnd,(RegOpnd *)slotIndexLoadedLabel,(LabelInstr *)branchToPatch,
                 labelHelper,(LabelInstr **)&taggedTypeOpnd,(BranchInstr **)&nextLabel,
                 (RegOpnd **)&hitRateOpnd);
    }
    if ((objectTypeOpnd._6_1_ & 1) != 0) {
      GenerateLookUpInIndexCacheHelper<true,false,true>
                (this,(Instr *)indexOpnd_local,opndSlotArray_local,opndSlotIndex_local,pRStack_50,
                 inlineCacheOpnd,(RegOpnd *)slotIndexLoadedLabel,(LabelInstr *)branchToPatch,
                 labelHelper,(LabelInstr **)&taggedTypeOpnd,(BranchInstr **)&nextLabel,
                 (RegOpnd **)&hitRateOpnd);
    }
  }
  if (nextLabel == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x416f,"(branchToPatch)","branchToPatch");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (taggedTypeOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4170,"(nextLabel)","nextLabel");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar3 = RealCount::Count((RealCount *)(taggedTypeOpnd + 3));
  if ((uVar3 != 1) ||
     (ppBVar6 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Head
                          ((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
                           &taggedTypeOpnd[2].field_0x18), (LabelInstr *)*ppBVar6 != nextLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4171,
                       "(nextLabel->labelRefs.Count() == 1 && nextLabel->labelRefs.Head() == branchToPatch)"
                       ,
                       "nextLabel->labelRefs.Count() == 1 && nextLabel->labelRefs.Head() == branchToPatch"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  IR::BranchInstr::SetTarget((BranchInstr *)nextLabel,labelHelper);
  IR::Instr::Remove((Instr *)taggedTypeOpnd);
  IR::Instr::InsertBefore((Instr *)indexOpnd_local,&branchToPatch->super_Instr);
  pIVar4 = IR::IndirOpnd::New(baseOpnd_local,hitRateOffset,TyInt32,this->m_func,false);
  src2 = IR::IntConstOpnd::New(1,TyInt32,this->m_func,false);
  InsertAdd(false,&pIVar4->super_Opnd,&pIVar4->super_Opnd,&src2->super_Opnd,(Instr *)indexOpnd_local
           );
  return;
}

Assistant:

void
Lowerer::GenerateLookUpInIndexCache(
    _In_ IR::Instr* instrInsert,
    _In_ IR::RegOpnd* indexOpnd,
    _In_ IR::RegOpnd* baseOpnd,
    _In_opt_ IR::RegOpnd* opndSlotArray,
    _In_opt_ IR::RegOpnd* opndSlotIndex,
    _In_ const uint32 inlineCacheOffset,
    _In_ const uint32 hitRateOffset,
    _In_ IR::LabelInstr* labelHelper,
    _In_ Js::FldInfoFlags flags) // = Js::FldInfo_NoInfo
{
    // Generates:
    //      MOV inlineCacheOpnd, index->inlineCache
    //      GenerateObjectTest(baseOpnd, $helper)         ; verify base is an object
    //      MOV objectTypeOpnd, baseOpnd->type
    //      GenerateDynamicLoadPolymorphicInlineCacheSlot(inlineCacheOpnd, objectTypeOpnd) ; loads inline cache for given type
    // if (checkLocalInlineSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckLocal, CheckInlineSlot> // checks local inline slots, goes to next on failure
    // if (checkLocalAuxSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckLocal, CheckAuxSlot> // checks local aux slots, goes to next on failure
    // if (fromProto && fromInlineSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckProto, CheckInlineSlot> // checks proto inline slots, goes to next on failure
    // if (fromProto && fromAuxSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckProto, CheckAuxSlot> // checks proto aux slots, goes to next on failure
    // if (doAdd && fromInlineSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckLocal, CheckInlineSlot, DoAdd> // checks typeWithoutProperty inline slots, goes to next on failure
    // if (doAdd && fromAuxSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckLocal, CheckAuxSlot, DoAdd> // checks typeWithoutProperty aux slots, goes to helper on failure
    // $slotIndexLoadedLabel
    //      INC indexOpnd->hitRate

    const bool fromInlineSlots = (flags & Js::FldInfo_FromInlineSlots) == Js::FldInfo_FromInlineSlots;
    const bool fromAuxSlots = (flags & Js::FldInfo_FromAuxSlots) == Js::FldInfo_FromAuxSlots;
    const bool fromLocal = (flags & Js::FldInfo_FromLocal) == Js::FldInfo_FromLocal;
    const bool fromProto = (flags & Js::FldInfo_FromProto) == Js::FldInfo_FromProto;
    const bool doAdd = (flags & Js::FldInfo_FromLocalWithoutProperty) == Js::FldInfo_FromLocalWithoutProperty;

    const bool checkLocalInlineSlots = flags == Js::FldInfo_NoInfo || (fromInlineSlots && fromLocal);
    const bool checkLocalAuxSlots = flags == Js::FldInfo_NoInfo || (fromAuxSlots && fromLocal);

    m_lowererMD.GenerateObjectTest(baseOpnd, instrInsert, labelHelper);

    IR::RegOpnd * objectTypeOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(objectTypeOpnd, IR::IndirOpnd::New(baseOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, m_func), instrInsert);

    IR::RegOpnd * inlineCacheOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(inlineCacheOpnd, IR::IndirOpnd::New(indexOpnd, inlineCacheOffset, TyMachPtr, m_func), instrInsert);

    GenerateDynamicLoadPolymorphicInlineCacheSlot(instrInsert, inlineCacheOpnd, objectTypeOpnd);

    IR::LabelInstr* slotIndexLoadedLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    IR::BranchInstr* branchToPatch = nullptr;
    IR::LabelInstr* nextLabel = nullptr;
    IR::RegOpnd* taggedTypeOpnd = nullptr;
    if (checkLocalInlineSlots)
    {
        GenerateLookUpInIndexCacheHelper<true /* CheckLocal */, true /* CheckInlineSlot */, false /* DoAdd */>(
            instrInsert,
            baseOpnd,
            opndSlotArray,
            opndSlotIndex,
            objectTypeOpnd,
            inlineCacheOpnd,
            slotIndexLoadedLabel,
            labelHelper,
            &nextLabel,
            &branchToPatch,
            &taggedTypeOpnd);
    }
    if (checkLocalAuxSlots)
    {
        GenerateLookUpInIndexCacheHelper<true /* CheckLocal */, false /* CheckInlineSlot */, false /* DoAdd */>(
            instrInsert,
            baseOpnd,
            opndSlotArray,
            opndSlotIndex,
            objectTypeOpnd,
            inlineCacheOpnd,
            slotIndexLoadedLabel,
            labelHelper,
            &nextLabel,
            &branchToPatch,
            &taggedTypeOpnd);
    }

    if (fromProto)
    {
        if (fromInlineSlots)
        {
            GenerateLookUpInIndexCacheHelper<false /* CheckLocal */, true /* CheckInlineSlot */, false /* DoAdd */>(
                instrInsert,
                baseOpnd,
                opndSlotArray,
                opndSlotIndex,
                objectTypeOpnd,
                inlineCacheOpnd,
                slotIndexLoadedLabel,
                labelHelper,
                &nextLabel,
                &branchToPatch,
                &taggedTypeOpnd);
        }
        if (fromAuxSlots)
        {
            GenerateLookUpInIndexCacheHelper<false /* CheckLocal */, false /* CheckInlineSlot */, false /* DoAdd */>(
                instrInsert,
                baseOpnd,
                opndSlotArray,
                opndSlotIndex,
                objectTypeOpnd,
                inlineCacheOpnd,
                slotIndexLoadedLabel,
                labelHelper,
                &nextLabel,
                &branchToPatch,
                &taggedTypeOpnd);
        }
    }
    if (doAdd)
    {
        Assert(opndSlotArray);

        if (fromInlineSlots)
        {
            GenerateLookUpInIndexCacheHelper<true /* CheckLocal */, true /* CheckInlineSlot */, true /* DoAdd */>(
                instrInsert,
                baseOpnd,
                opndSlotArray,
                opndSlotIndex,
                objectTypeOpnd,
                inlineCacheOpnd,
                slotIndexLoadedLabel,
                labelHelper,
                &nextLabel,
                &branchToPatch,
                &taggedTypeOpnd);
        }
        if (fromAuxSlots)
        {
            GenerateLookUpInIndexCacheHelper<true /* CheckLocal */, false /* CheckInlineSlot */, true /* DoAdd */>(
                instrInsert,
                baseOpnd,
                opndSlotArray,
                opndSlotIndex,
                objectTypeOpnd,
                inlineCacheOpnd,
                slotIndexLoadedLabel,
                labelHelper,
                &nextLabel,
                &branchToPatch,
                &taggedTypeOpnd);
        }
    }
    Assert(branchToPatch);
    Assert(nextLabel);
    Assert(nextLabel->labelRefs.Count() == 1 && nextLabel->labelRefs.Head() == branchToPatch);

    branchToPatch->SetTarget(labelHelper);
    nextLabel->Remove();

    instrInsert->InsertBefore(slotIndexLoadedLabel);

    IR::IndirOpnd * hitRateOpnd = IR::IndirOpnd::New(indexOpnd, hitRateOffset, TyInt32, m_func);
    IR::IntConstOpnd * incOpnd = IR::IntConstOpnd::New(1, TyInt32, m_func);
    // overflow check: not needed here, we don't allocate anything with hitrate
    InsertAdd(false, hitRateOpnd, hitRateOpnd, incOpnd, instrInsert);
}